

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebur128.c
# Opt level: O0

int ebur128_init_resampler(ebur128_state *st)

{
  interpolator *piVar1;
  float *pfVar2;
  int errcode;
  ebur128_state *st_local;
  
  if (st->samplerate < 96000) {
    piVar1 = interp_create(0x31,4,st->channels);
    st->d->interp = piVar1;
    if (st->d->interp == (interpolator *)0x0) {
      return 1;
    }
  }
  else {
    if (0x2edff < st->samplerate) {
      st->d->resampler_buffer_input = (float *)0x0;
      st->d->resampler_buffer_output = (float *)0x0;
      st->d->interp = (interpolator *)0x0;
      return 0;
    }
    piVar1 = interp_create(0x31,2,st->channels);
    st->d->interp = piVar1;
    if (st->d->interp == (interpolator *)0x0) {
      return 1;
    }
  }
  st->d->resampler_buffer_input_frames = st->d->samples_in_100ms << 2;
  pfVar2 = (float *)malloc(st->d->resampler_buffer_input_frames * (ulong)st->channels * 4);
  st->d->resampler_buffer_input = pfVar2;
  if (st->d->resampler_buffer_input == (float *)0x0) {
    interp_destroy(st->d->interp);
    st->d->interp = (interpolator *)0x0;
  }
  else {
    st->d->resampler_buffer_output_frames =
         st->d->resampler_buffer_input_frames * (ulong)st->d->interp->factor;
    pfVar2 = (float *)malloc(st->d->resampler_buffer_output_frames * (ulong)st->channels * 4);
    st->d->resampler_buffer_output = pfVar2;
    if (st->d->resampler_buffer_output != (float *)0x0) {
      return 0;
    }
  }
  free(st->d->resampler_buffer_input);
  st->d->resampler_buffer_input = (float *)0x0;
  return 1;
}

Assistant:

static int ebur128_init_resampler(ebur128_state* st) {
  int errcode = EBUR128_SUCCESS;

  if (st->samplerate < 96000) {
    st->d->interp = interp_create(49, 4, st->channels);
    CHECK_ERROR(!st->d->interp, EBUR128_ERROR_NOMEM, exit)
  } else if (st->samplerate < 192000) {
    st->d->interp = interp_create(49, 2, st->channels);
    CHECK_ERROR(!st->d->interp, EBUR128_ERROR_NOMEM, exit)
  } else {
    st->d->resampler_buffer_input = NULL;
    st->d->resampler_buffer_output = NULL;
    st->d->interp = NULL;
    goto exit;
  }

  st->d->resampler_buffer_input_frames = st->d->samples_in_100ms * 4;
  st->d->resampler_buffer_input = (float*) malloc(
      st->d->resampler_buffer_input_frames * st->channels * sizeof(float));
  CHECK_ERROR(!st->d->resampler_buffer_input, EBUR128_ERROR_NOMEM, free_interp)

  st->d->resampler_buffer_output_frames =
      st->d->resampler_buffer_input_frames * st->d->interp->factor;
  st->d->resampler_buffer_output = (float*) malloc(
      st->d->resampler_buffer_output_frames * st->channels * sizeof(float));
  CHECK_ERROR(!st->d->resampler_buffer_output, EBUR128_ERROR_NOMEM, free_input)

  return errcode;

free_interp:
  interp_destroy(st->d->interp);
  st->d->interp = NULL;
free_input:
  free(st->d->resampler_buffer_input);
  st->d->resampler_buffer_input = NULL;
exit:
  return errcode;
}